

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testMethod_erase(void)

{
  String *this;
  ostream *poVar1;
  bool bVar2;
  int iVar3;
  String str;
  String SStack_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testMethod_erase()\n",0x13);
  cm::String::String<char_const(&)[8],void>(&SStack_28,(char (*) [8])"abcdefg");
  this = cm::String::erase(&SStack_28,5,0xffffffffffffffff);
  cm::String::erase(this,1,2);
  if (SStack_28.view_._M_len == 3) {
    if (((*SStack_28.view_._M_str == 'a') && (SStack_28.view_._M_str[1] == 'd')) &&
       (bVar2 = true, SStack_28.view_._M_str[2] == 'e')) goto LAB_00186147;
    iVar3 = 0x29b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(std::strncmp(str.data(), \"ade\", 3) == 0) failed on line ",0x44);
  }
  else {
    iVar3 = 0x29a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 3) failed on line ",0x2c);
  }
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  bVar2 = false;
LAB_00186147:
  if (SStack_28.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (SStack_28.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar2;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}